

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O0

void __thiscall chrono::turtlebot::TurtleBot::Initialize(TurtleBot *this)

{
  ChSystem *pCVar1;
  element_type *this_00;
  element_type *this_01;
  element_type *this_02;
  element_type *this_03;
  __shared_ptr_access<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var2;
  element_type *this_04;
  __shared_ptr_access<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var3;
  element_type *this_05;
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var4;
  element_type *peVar5;
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var6;
  element_type *this_06;
  long lVar7;
  ChQuaternion<double> local_830;
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [48];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [48];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [48];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [48];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [48];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [40];
  undefined1 local_638 [8];
  ChVector<double> top_plate_rel_pos;
  undefined1 local_608 [8];
  ChVector<double> middle_plate_rel_pos;
  undefined1 local_5d8 [8];
  ChVector<double> bottom_plate_rel_pos;
  undefined1 local_5b8 [4];
  int i_2;
  ChVector<double> top_rod_rel_pos [6];
  ChVector<double> middle_rod_rel_pos [6];
  ChVector<double> bottom_rod_rel_pos [6];
  ChVector<double> local_400;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [32];
  ChVector<double> local_3a8;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [32];
  value_type local_350;
  ChVector<double> local_340;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [32];
  ChVector<double> local_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [32];
  value_type local_290;
  undefined1 local_280 [8];
  ChQuaternion<double> z2x;
  ChQuaternion<double> z2y;
  undefined1 local_228 [8];
  shared_ptr<chrono::ChFunction_Const> const_speed_function_r;
  undefined1 local_210 [8];
  shared_ptr<chrono::ChFunction_Const> const_speed_function_l;
  double rod_u_5_z;
  double rod_u_5_y;
  double rod_u_5_x;
  double rod_u_4_z;
  double rod_u_4_y;
  double rod_u_4_x;
  double rod_u_3_z;
  double rod_u_3_y;
  double rod_u_3_x;
  double rod_u_2_z;
  double rod_u_2_y;
  double rod_u_2_x;
  double rod_u_1_z;
  double rod_u_1_y;
  double rod_u_1_x;
  double rod_u_0_z;
  double rod_u_0_y;
  double rod_u_0_x;
  double rod_m_5_z;
  double rod_m_5_y;
  double rod_m_5_x;
  double rod_m_4_z;
  double rod_m_4_y;
  double rod_m_4_x;
  double rod_m_3_z;
  double rod_m_3_y;
  double rod_m_3_x;
  double rod_m_2_z;
  double rod_m_2_y;
  double rod_m_2_x;
  double rod_m_1_z;
  double rod_m_1_y;
  double rod_m_1_x;
  double rod_m_0_z;
  double rod_m_0_y;
  double rod_m_0_x;
  double rod_s_5_z;
  double rod_s_5_y;
  double rod_s_5_x;
  double rod_s_4_z;
  double rod_s_4_y;
  double rod_s_4_x;
  double rod_s_3_z;
  double rod_s_3_y;
  double rod_s_3_x;
  double rod_s_2_z;
  double rod_s_2_y;
  double rod_s_2_x;
  double rod_s_1_z;
  double rod_s_1_y;
  double rod_s_1_x;
  double rod_s_0_z;
  double rod_s_0_y;
  double rod_s_0_x;
  double pwz;
  double pwy;
  double pwx;
  double dwz;
  double dwy;
  double dwx;
  int i_1;
  int i;
  TurtleBot *this_local;
  
  this_00 = std::
            __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_chassis);
  Turtlebot_Chassis::Initialize(this_00);
  this_01 = std::
            __shared_ptr_access<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_bottom_plate);
  Turtlebot_BottomPlate::Initialize(this_01);
  this_02 = std::
            __shared_ptr_access<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_middle_plate);
  Turtlebot_MiddlePlate::Initialize(this_02);
  this_03 = std::
            __shared_ptr_access<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_top_plate);
  Turtlebot_TopPlate::Initialize(this_03);
  for (dwx._4_4_ = 0; dwx._4_4_ < 2; dwx._4_4_ = dwx._4_4_ + 1) {
    p_Var2 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
                ::operator[](&this->m_drive_wheels,(long)dwx._4_4_);
    this_04 = std::
              __shared_ptr_access<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var2);
    Turtlebot_ActiveWheel::Initialize(this_04);
    p_Var3 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
                ::operator[](&this->m_passive_wheels,(long)dwx._4_4_);
    this_05 = std::
              __shared_ptr_access<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var3);
    Turtlebot_PassiveWheel::Initialize(this_05);
  }
  for (dwx._0_4_ = 0; dwx._0_4_ < 6; dwx._0_4_ = dwx._0_4_ + 1) {
    p_Var4 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                ::operator[](&this->m_1st_level_rods,(long)dwx._0_4_);
    peVar5 = std::
             __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    Turtlebot_Rod_Short::Initialize(peVar5);
    p_Var4 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                ::operator[](&this->m_2nd_level_rods,(long)dwx._0_4_);
    peVar5 = std::
             __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    Turtlebot_Rod_Short::Initialize(peVar5);
    p_Var6 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
                ::operator[](&this->m_3rd_level_rods,(long)dwx._0_4_);
    this_06 = std::
              __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var6);
    Turtlebot_Rod_Long::Initialize(this_06);
  }
  const_speed_function_l.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fca631f8a0902de;
  const_speed_function_r.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc00921fb54442d18;
  chrono_types::make_shared<chrono::ChFunction_Const,_double,_0>((double *)local_210);
  chrono_types::make_shared<chrono::ChFunction_Const,_double,_0>((double *)local_228);
  std::
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ::push_back(&this->m_motors_func,(value_type *)local_210);
  std::
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ::push_back(&this->m_motors_func,(value_type *)local_228);
  chrono::Q_from_AngX(1.5707963267948966);
  chrono::Q_from_AngY(-1.5707963267948966);
  p_Var2 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
              ::operator[](&this->m_drive_wheels,0);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(p_Var2);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_2b0);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
            ((shared_ptr<chrono::ChBody> *)(local_2b0 + 0x10),
             (shared_ptr<chrono::ChBodyAuxRef> *)local_2b0);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_chassis);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_2c0);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_chassis);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_2d0);
  pCVar1 = this->m_system;
  ChVector<double>::ChVector(&local_2e8,0.0,0.11505,0.03735);
  std::shared_ptr<chrono::ChFunction_Const>::shared_ptr
            ((shared_ptr<chrono::ChFunction_Const> *)(local_308 + 0x10),
             (shared_ptr<chrono::ChFunction_Const> *)local_210);
  AddMotor((turtlebot *)&local_290,(shared_ptr<chrono::ChBody> *)(local_2b0 + 0x10),
           (shared_ptr<chrono::ChBodyAuxRef> *)local_2c0,
           (shared_ptr<chrono::ChBodyAuxRef> *)local_2d0,pCVar1,&local_2e8,
           (ChQuaternion<double> *)(z2x.m_data + 3),
           (shared_ptr<chrono::ChFunction_Const> *)(local_308 + 0x10));
  std::
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ::push_back(&this->m_motors,&local_290);
  std::shared_ptr<chrono::ChLinkMotorRotationSpeed>::~shared_ptr(&local_290);
  std::shared_ptr<chrono::ChFunction_Const>::~shared_ptr
            ((shared_ptr<chrono::ChFunction_Const> *)(local_308 + 0x10));
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_2d0);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_2c0);
  std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)(local_2b0 + 0x10));
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_2b0);
  p_Var3 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
              ::operator[](&this->m_passive_wheels,0);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(p_Var3);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_308);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_chassis);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_318);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_chassis);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_328);
  pCVar1 = this->m_system;
  ChVector<double>::ChVector(&local_340,0.11505,0.0,0.02015);
  AddRevoluteJoint((shared_ptr<chrono::ChBodyAuxRef> *)local_308,
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_318,
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_328,pCVar1,&local_340,
                   (ChQuaternion<double> *)local_280);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_328);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_318);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_308);
  p_Var2 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
              ::operator[](&this->m_drive_wheels,1);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_ActiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(p_Var2);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_370);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
            ((shared_ptr<chrono::ChBody> *)(local_370 + 0x10),
             (shared_ptr<chrono::ChBodyAuxRef> *)local_370);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_chassis);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_380);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_chassis);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_390);
  pCVar1 = this->m_system;
  ChVector<double>::ChVector(&local_3a8,0.0,-0.11505,0.03735);
  std::shared_ptr<chrono::ChFunction_Const>::shared_ptr
            ((shared_ptr<chrono::ChFunction_Const> *)(local_3c8 + 0x10),
             (shared_ptr<chrono::ChFunction_Const> *)local_228);
  AddMotor((turtlebot *)&local_350,(shared_ptr<chrono::ChBody> *)(local_370 + 0x10),
           (shared_ptr<chrono::ChBodyAuxRef> *)local_380,
           (shared_ptr<chrono::ChBodyAuxRef> *)local_390,pCVar1,&local_3a8,
           (ChQuaternion<double> *)(z2x.m_data + 3),
           (shared_ptr<chrono::ChFunction_Const> *)(local_3c8 + 0x10));
  std::
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ::push_back(&this->m_motors,&local_350);
  std::shared_ptr<chrono::ChLinkMotorRotationSpeed>::~shared_ptr(&local_350);
  std::shared_ptr<chrono::ChFunction_Const>::~shared_ptr
            ((shared_ptr<chrono::ChFunction_Const> *)(local_3c8 + 0x10));
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_390);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_380);
  std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)(local_370 + 0x10));
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_370);
  p_Var3 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
              ::operator[](&this->m_passive_wheels,1);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_PassiveWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(p_Var3);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_3c8);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_chassis);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_3d8);
  std::
  __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_chassis);
  Turtlebot_Part::GetBody((Turtlebot_Part *)local_3e8);
  pCVar1 = this->m_system;
  ChVector<double>::ChVector(&local_400,-0.11505,0.0,0.02015);
  AddRevoluteJoint((shared_ptr<chrono::ChBodyAuxRef> *)local_3c8,
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_3d8,
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_3e8,pCVar1,&local_400,
                   (ChQuaternion<double> *)local_280);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_3e8);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_3d8);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_3c8);
  ChVector<double>::ChVector
            ((ChVector<double> *)(middle_rod_rel_pos[5].m_data + 2),-0.0565,0.11992,0.09615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(bottom_rod_rel_pos[0].m_data + 2),0.0535,0.11992,0.09615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(bottom_rod_rel_pos[1].m_data + 2),0.1185,0.08192,0.09615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(bottom_rod_rel_pos[2].m_data + 2),0.1185,-0.08192,0.09615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(bottom_rod_rel_pos[3].m_data + 2),0.0535,-0.11992,0.09615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(bottom_rod_rel_pos[4].m_data + 2),-0.0565,-0.11992,0.09615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(top_rod_rel_pos[5].m_data + 2),-0.10394,0.09792,0.15015);
  ChVector<double>::ChVector
            ((ChVector<double> *)(middle_rod_rel_pos[0].m_data + 2),-0.0015,0.16192,0.15015);
  ChVector<double>::ChVector
            ((ChVector<double> *)(middle_rod_rel_pos[1].m_data + 2),0.0687,0.13132,0.15015);
  ChVector<double>::ChVector
            ((ChVector<double> *)(middle_rod_rel_pos[2].m_data + 2),0.0687,-0.13132,0.15015);
  ChVector<double>::ChVector
            ((ChVector<double> *)(middle_rod_rel_pos[3].m_data + 2),-0.0015,-0.16192,0.15015);
  ChVector<double>::ChVector
            ((ChVector<double> *)(middle_rod_rel_pos[4].m_data + 2),-0.10394,-0.09792,0.15015);
  ChVector<double>::ChVector((ChVector<double> *)local_5b8,-0.10394,0.09792,0.20615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(top_rod_rel_pos[0].m_data + 2),-0.0015,0.16192,0.20615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(top_rod_rel_pos[1].m_data + 2),0.0687,0.13132,0.20615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(top_rod_rel_pos[2].m_data + 2),0.0687,-0.13132,0.20615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(top_rod_rel_pos[3].m_data + 2),-0.0015,-0.16192,0.20615);
  ChVector<double>::ChVector
            ((ChVector<double> *)(top_rod_rel_pos[4].m_data + 2),-0.10394,-0.09792,
             (double)const_speed_function_l.
                     super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  for (bottom_plate_rel_pos.m_data[2]._4_4_ = 0; bottom_plate_rel_pos.m_data[2]._4_4_ < 6;
      bottom_plate_rel_pos.m_data[2]._4_4_ = bottom_plate_rel_pos.m_data[2]._4_4_ + 1) {
    lVar7 = (long)bottom_plate_rel_pos.m_data[2]._4_4_;
    ChVector<double>::ChVector((ChVector<double> *)(middle_plate_rel_pos.m_data + 2),0.0,0.0,0.05);
    ChVector<double>::operator+
              ((ChVector<double> *)local_5d8,
               (ChVector<double> *)(middle_rod_rel_pos[lVar7 + 5].m_data + 2),
               (ChVector<double> *)(middle_plate_rel_pos.m_data + 2));
    lVar7 = (long)bottom_plate_rel_pos.m_data[2]._4_4_;
    ChVector<double>::ChVector((ChVector<double> *)(top_plate_rel_pos.m_data + 2),0.0,0.0,0.05);
    ChVector<double>::operator+
              ((ChVector<double> *)local_608,
               (ChVector<double> *)(top_rod_rel_pos[lVar7 + 5].m_data + 2),
               (ChVector<double> *)(top_plate_rel_pos.m_data + 2));
    lVar7 = (long)bottom_plate_rel_pos.m_data[2]._4_4_;
    ChVector<double>::ChVector((ChVector<double> *)(local_660 + 0x10),0.0,0.0,0.2);
    ChVector<double>::operator+
              ((ChVector<double> *)local_638,(ChVector<double> *)(local_5b8 + lVar7 * 0x18),
               (ChVector<double> *)(local_660 + 0x10));
    p_Var4 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                ::operator[](&this->m_1st_level_rods,(long)bottom_plate_rel_pos.m_data[2]._4_4_);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var4);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_660);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_670);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_680);
    pCVar1 = this->m_system;
    lVar7 = (long)bottom_plate_rel_pos.m_data[2]._4_4_;
    ChQuaternion<double>::ChQuaternion((ChQuaternion<double> *)(local_6b0 + 0x10),1.0,0.0,0.0,0.0);
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)local_660,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_670,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_680,pCVar1,
                 (ChVector<double> *)(middle_rod_rel_pos[lVar7 + 5].m_data + 2),
                 (ChQuaternion<double> *)(local_6b0 + 0x10));
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_680);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_670);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_660);
    p_Var4 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                ::operator[](&this->m_1st_level_rods,(long)bottom_plate_rel_pos.m_data[2]._4_4_);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var4);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_6b0);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_bottom_plate);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_6c0);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_6d0);
    pCVar1 = this->m_system;
    ChQuaternion<double>::ChQuaternion((ChQuaternion<double> *)(local_700 + 0x10),1.0,0.0,0.0,0.0);
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)local_6b0,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_6c0,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_6d0,pCVar1,(ChVector<double> *)local_5d8,
                 (ChQuaternion<double> *)(local_700 + 0x10));
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_6d0);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_6c0);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_6b0);
    p_Var4 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                ::operator[](&this->m_2nd_level_rods,(long)bottom_plate_rel_pos.m_data[2]._4_4_);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var4);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_700);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_BottomPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_bottom_plate);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_710);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_720);
    pCVar1 = this->m_system;
    lVar7 = (long)bottom_plate_rel_pos.m_data[2]._4_4_;
    ChQuaternion<double>::ChQuaternion((ChQuaternion<double> *)(local_750 + 0x10),1.0,0.0,0.0,0.0);
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)local_700,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_710,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_720,pCVar1,
                 (ChVector<double> *)(middle_rod_rel_pos[lVar7 + 5].m_data + 2),
                 (ChQuaternion<double> *)(local_750 + 0x10));
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_720);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_710);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_700);
    p_Var4 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
                ::operator[](&this->m_2nd_level_rods,(long)bottom_plate_rel_pos.m_data[2]._4_4_);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Short,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var4);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_750);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_middle_plate);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_760);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_770);
    pCVar1 = this->m_system;
    ChQuaternion<double>::ChQuaternion((ChQuaternion<double> *)(local_7a0 + 0x10),1.0,0.0,0.0,0.0);
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)local_750,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_760,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_770,pCVar1,(ChVector<double> *)local_608,
                 (ChQuaternion<double> *)(local_7a0 + 0x10));
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_770);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_760);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_750);
    p_Var6 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
                ::operator[](&this->m_3rd_level_rods,(long)bottom_plate_rel_pos.m_data[2]._4_4_);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var6);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_7a0);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_MiddlePlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_middle_plate);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_7b0);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_7c0);
    pCVar1 = this->m_system;
    lVar7 = (long)bottom_plate_rel_pos.m_data[2]._4_4_;
    ChQuaternion<double>::ChQuaternion((ChQuaternion<double> *)(local_7f0 + 0x10),1.0,0.0,0.0,0.0);
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)local_7a0,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_7b0,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_7c0,pCVar1,
                 (ChVector<double> *)(local_5b8 + lVar7 * 0x18),
                 (ChQuaternion<double> *)(local_7f0 + 0x10));
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_7c0);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_7b0);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_7a0);
    p_Var6 = (__shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
                ::operator[](&this->m_3rd_level_rods,(long)bottom_plate_rel_pos.m_data[2]._4_4_);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Rod_Long,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var6);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_7f0);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_TopPlate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_top_plate);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_800);
    std::
    __shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::turtlebot::Turtlebot_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    Turtlebot_Part::GetBody((Turtlebot_Part *)local_810);
    pCVar1 = this->m_system;
    ChQuaternion<double>::ChQuaternion(&local_830,1.0,0.0,0.0,0.0);
    AddLockJoint((shared_ptr<chrono::ChBodyAuxRef> *)local_7f0,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_800,
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_810,pCVar1,(ChVector<double> *)local_638,
                 &local_830);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_810);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_800);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_7f0);
  }
  std::shared_ptr<chrono::ChFunction_Const>::~shared_ptr
            ((shared_ptr<chrono::ChFunction_Const> *)local_228);
  std::shared_ptr<chrono::ChFunction_Const>::~shared_ptr
            ((shared_ptr<chrono::ChFunction_Const> *)local_210);
  return;
}

Assistant:

void TurtleBot::Initialize() {
    m_chassis->Initialize();
    m_bottom_plate->Initialize();
    m_middle_plate->Initialize();
    m_top_plate->Initialize();
    for (int i = 0; i < 2; i++) {
        m_drive_wheels[i]->Initialize();
        m_passive_wheels[i]->Initialize();
    }

    for (int i = 0; i < 6; i++) {
        m_1st_level_rods[i]->Initialize();
        m_2nd_level_rods[i]->Initialize();
        m_3rd_level_rods[i]->Initialize();
    }

    // redeclare necessary location variables
    double dwx = 0;
    double dwy = 0.11505;
    double dwz = 0.03735;

    double pwx = 0.11505;
    double pwy = 0;
    double pwz = 0.02015;

    double rod_s_0_x = -0.0565;
    double rod_s_0_y = 0.11992;
    double rod_s_0_z = 0.09615;

    double rod_s_1_x = 0.0535;
    double rod_s_1_y = 0.11992;
    double rod_s_1_z = 0.09615;

    double rod_s_2_x = 0.11850;
    double rod_s_2_y = 0.08192;
    double rod_s_2_z = 0.09615;

    double rod_s_3_x = 0.11850;
    double rod_s_3_y = -0.08192;
    double rod_s_3_z = 0.09615;

    double rod_s_4_x = 0.0535;
    double rod_s_4_y = -0.11992;
    double rod_s_4_z = 0.09615;

    double rod_s_5_x = -0.0565;
    double rod_s_5_y = -0.11992;
    double rod_s_5_z = 0.09615;

    double rod_m_0_x = -0.10394;
    double rod_m_0_y = 0.09792;
    double rod_m_0_z = 0.15015;

    double rod_m_1_x = -0.0015;
    double rod_m_1_y = 0.16192;
    double rod_m_1_z = 0.15015;

    double rod_m_2_x = 0.0687;
    double rod_m_2_y = 0.13132;
    double rod_m_2_z = 0.15015;

    double rod_m_3_x = 0.0687;
    double rod_m_3_y = -0.13132;
    double rod_m_3_z = 0.15015;

    double rod_m_4_x = -0.0015;
    double rod_m_4_y = -0.16192;
    double rod_m_4_z = 0.15015;

    double rod_m_5_x = -0.10394;
    double rod_m_5_y = -0.09792;
    double rod_m_5_z = 0.15015;

    double rod_u_0_x = -0.10394;
    double rod_u_0_y = 0.09792;
    double rod_u_0_z = 0.20615;

    double rod_u_1_x = -0.0015;
    double rod_u_1_y = 0.16192;
    double rod_u_1_z = 0.20615;

    double rod_u_2_x = 0.0687;
    double rod_u_2_y = 0.13132;
    double rod_u_2_z = 0.20615;

    double rod_u_3_x = 0.0687;
    double rod_u_3_y = -0.13132;
    double rod_u_3_z = 0.20615;

    double rod_u_4_x = -0.0015;
    double rod_u_4_y = -0.16192;
    double rod_u_4_z = 0.20615;

    double rod_u_5_x = -0.10394;
    double rod_u_5_y = -0.09792;
    double rod_u_5_z = 0.20615;

    // add motors and revolute joints on the active and passive wheels
    auto const_speed_function_l = chrono_types::make_shared<ChFunction_Const>(-CH_C_PI);
    auto const_speed_function_r = chrono_types::make_shared<ChFunction_Const>(-CH_C_PI);
    m_motors_func.push_back(const_speed_function_l);
    m_motors_func.push_back(const_speed_function_r);

    ChQuaternion<> z2y = Q_from_AngX(CH_C_PI_2);
    ChQuaternion<> z2x = Q_from_AngY(-CH_C_PI_2);

    m_motors.push_back(AddMotor(m_drive_wheels[0]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                                ChVector<>(dwx, dwy, dwz), z2y, const_speed_function_l));
    AddRevoluteJoint(m_passive_wheels[0]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                     ChVector<>(pwx, pwy, pwz), z2x);

    m_motors.push_back(AddMotor(m_drive_wheels[1]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                                ChVector<>(dwx, -dwy, dwz), z2y, const_speed_function_r));
    AddRevoluteJoint(m_passive_wheels[1]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                     ChVector<>(-pwx, pwy, pwz), z2x);

    // add fixity on all rods and plates
    // There are six constraints needed:
    // chassis -> bottom rods
    // bottom rods -> bottom plate
    // bottom plate -> middle rods
    // middle rods -> middle plate
    // middle plate -> top rods
    // top rods -> top plate

    ChVector<> bottom_rod_rel_pos[] = {ChVector<>(rod_s_0_x, rod_s_0_y, rod_s_0_z),  //
                                       ChVector<>(rod_s_1_x, rod_s_1_y, rod_s_1_z),  //
                                       ChVector<>(rod_s_2_x, rod_s_2_y, rod_s_2_z),  //
                                       ChVector<>(rod_s_3_x, rod_s_3_y, rod_s_3_z),  //
                                       ChVector<>(rod_s_4_x, rod_s_4_y, rod_s_4_z),  //
                                       ChVector<>(rod_s_5_x, rod_s_5_y, rod_s_5_z)};
    ChVector<> middle_rod_rel_pos[] = {ChVector<>(rod_m_0_x, rod_m_0_y, rod_m_0_z),  //
                                       ChVector<>(rod_m_1_x, rod_m_1_y, rod_m_1_z),  //
                                       ChVector<>(rod_m_2_x, rod_m_2_y, rod_m_2_z),  //
                                       ChVector<>(rod_m_3_x, rod_m_3_y, rod_m_3_z),  //
                                       ChVector<>(rod_m_4_x, rod_m_4_y, rod_m_4_z),  //
                                       ChVector<>(rod_m_5_x, rod_m_5_y, rod_m_5_z)};
    ChVector<> top_rod_rel_pos[] = {ChVector<>(rod_u_0_x, rod_u_0_y, rod_u_0_z),  //
                                    ChVector<>(rod_u_1_x, rod_u_1_y, rod_u_1_z),  //
                                    ChVector<>(rod_u_2_x, rod_u_2_y, rod_u_2_z),  //
                                    ChVector<>(rod_u_3_x, rod_u_3_y, rod_u_3_z),  //
                                    ChVector<>(rod_u_4_x, rod_u_4_y, rod_u_4_z),  //
                                    ChVector<>(rod_u_5_x, rod_u_5_y, rod_u_5_z)};

    for (int i = 0; i < 6; i++) {
        ChVector<> bottom_plate_rel_pos = bottom_rod_rel_pos[i] + ChVector<>(0, 0, 0.05);
        ChVector<> middle_plate_rel_pos = middle_rod_rel_pos[i] + ChVector<>(0, 0, 0.05);
        ChVector<> top_plate_rel_pos = top_rod_rel_pos[i] + ChVector<>(0, 0, 0.2);

        AddLockJoint(m_1st_level_rods[i]->GetBody(), m_chassis->GetBody(), m_chassis->GetBody(), m_system,
                     bottom_rod_rel_pos[i], ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_1st_level_rods[i]->GetBody(), m_bottom_plate->GetBody(), m_chassis->GetBody(), m_system,
                     bottom_plate_rel_pos, ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_2nd_level_rods[i]->GetBody(), m_bottom_plate->GetBody(), m_chassis->GetBody(), m_system,
                     bottom_rod_rel_pos[i], ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_2nd_level_rods[i]->GetBody(), m_middle_plate->GetBody(), m_chassis->GetBody(), m_system,
                     middle_plate_rel_pos, ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_3rd_level_rods[i]->GetBody(), m_middle_plate->GetBody(), m_chassis->GetBody(), m_system,
                     top_rod_rel_pos[i], ChQuaternion<>(1, 0, 0, 0));
        AddLockJoint(m_3rd_level_rods[i]->GetBody(), m_top_plate->GetBody(), m_chassis->GetBody(), m_system,
                     top_plate_rel_pos, ChQuaternion<>(1, 0, 0, 0));
    }
}